

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void capnp::_::WireHelpers::transferPointer
               (SegmentBuilder *dstSegment,WirePointer *dst,SegmentBuilder *srcSegment,
               WirePointer *srcTag,word *srcPtr)

{
  Kind KVar1;
  WordCountN<17> WVar2;
  SegmentWordCount SVar3;
  SegmentId SVar4;
  WirePointer *this;
  BuilderArena *this_00;
  AllocateResult AVar5;
  SegmentBuilder *farSegment;
  AllocateResult allocation;
  WirePointer *landingPad;
  word *srcPtr_local;
  WirePointer *srcTag_local;
  SegmentBuilder *srcSegment_local;
  WirePointer *dst_local;
  SegmentBuilder *dstSegment_local;
  
  if (dstSegment == srcSegment) {
    KVar1 = WirePointer::kind(srcTag);
    if ((KVar1 == STRUCT) &&
       (WVar2 = WirePointer::StructRef::wordSize(&(srcTag->field_1).structRef), WVar2 == 0)) {
      WirePointer::setKindAndTargetForEmptyStruct(dst);
    }
    else {
      KVar1 = WirePointer::kind(srcTag);
      WirePointer::setKindAndTarget(dst,KVar1,srcPtr,dstSegment);
    }
    copyMemory<unsigned_int>(&(dst->field_1).upper32Bits,&(srcTag->field_1).upper32Bits);
  }
  else {
    this = (WirePointer *)SegmentBuilder::allocate(srcSegment,1);
    if (this == (WirePointer *)0x0) {
      this_00 = SegmentBuilder::getArena(srcSegment);
      AVar5 = BuilderArena::allocate(this_00,2);
      farSegment = AVar5.segment;
      allocation.segment = (SegmentBuilder *)AVar5.words;
      SVar3 = SegmentReader::getOffsetTo(&srcSegment->super_SegmentReader,srcPtr);
      WirePointer::setFar((WirePointer *)allocation.segment,false,SVar3);
      SVar4 = SegmentReader::getSegmentId(&srcSegment->super_SegmentReader);
      DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_>::set
                ((DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_> *)
                 ((long)&((allocation.segment)->super_SegmentReader).arena + 4),
                 (Id<unsigned_int,_capnp::_::Segment>)SVar4.value);
      KVar1 = WirePointer::kind(srcTag);
      WirePointer::setKindWithZeroOffset
                ((WirePointer *)&((allocation.segment)->super_SegmentReader).id,KVar1);
      copyMemory<unsigned_int>
                ((uint *)&((allocation.segment)->super_SegmentReader).field_0xc,
                 &(srcTag->field_1).upper32Bits);
      SVar3 = SegmentReader::getOffsetTo
                        (&farSegment->super_SegmentReader,(word *)allocation.segment);
      WirePointer::setFar(dst,true,SVar3);
      SVar4 = SegmentReader::getSegmentId(&farSegment->super_SegmentReader);
      WirePointer::FarRef::set(&(dst->field_1).farRef,SVar4);
    }
    else {
      KVar1 = WirePointer::kind(srcTag);
      WirePointer::setKindAndTarget(this,KVar1,srcPtr,srcSegment);
      copyMemory<unsigned_int>(&(this->field_1).upper32Bits,&(srcTag->field_1).upper32Bits);
      SVar3 = SegmentReader::getOffsetTo(&srcSegment->super_SegmentReader,(word *)this);
      WirePointer::setFar(dst,false,SVar3);
      SVar4 = SegmentReader::getSegmentId(&srcSegment->super_SegmentReader);
      WirePointer::FarRef::set(&(dst->field_1).farRef,SVar4);
    }
  }
  return;
}

Assistant:

static void transferPointer(SegmentBuilder* dstSegment, WirePointer* dst,
                              SegmentBuilder* srcSegment, const WirePointer* srcTag,
                              word* srcPtr) {
    // Like the other overload, but splits src into a tag and a target.  Particularly useful for
    // OrphanBuilder.

    if (dstSegment == srcSegment) {
      // Same segment, so create a direct pointer.

      if (srcTag->kind() == WirePointer::STRUCT && srcTag->structRef.wordSize() == ZERO * WORDS) {
        dst->setKindAndTargetForEmptyStruct();
      } else {
        dst->setKindAndTarget(srcTag->kind(), srcPtr, dstSegment);
      }

      // We can just copy the upper 32 bits.  (Use memcpy() to comply with aliasing rules.)
      copyMemory(&dst->upper32Bits, &srcTag->upper32Bits);
    } else {
      // Need to create a far pointer.  Try to allocate it in the same segment as the source, so
      // that it doesn't need to be a double-far.

      WirePointer* landingPad =
          reinterpret_cast<WirePointer*>(srcSegment->allocate(G(1) * WORDS));
      if (landingPad == nullptr) {
        // Darn, need a double-far.
        auto allocation = srcSegment->getArena()->allocate(G(2) * WORDS);
        SegmentBuilder* farSegment = allocation.segment;
        landingPad = reinterpret_cast<WirePointer*>(allocation.words);

        landingPad[0].setFar(false, srcSegment->getOffsetTo(srcPtr));
        landingPad[0].farRef.segmentId.set(srcSegment->getSegmentId());

        landingPad[1].setKindWithZeroOffset(srcTag->kind());
        copyMemory(&landingPad[1].upper32Bits, &srcTag->upper32Bits);

        dst->setFar(true, farSegment->getOffsetTo(reinterpret_cast<word*>(landingPad)));
        dst->farRef.set(farSegment->getSegmentId());
      } else {
        // Simple landing pad is just a pointer.
        landingPad->setKindAndTarget(srcTag->kind(), srcPtr, srcSegment);
        copyMemory(&landingPad->upper32Bits, &srcTag->upper32Bits);

        dst->setFar(false, srcSegment->getOffsetTo(reinterpret_cast<word*>(landingPad)));
        dst->farRef.set(srcSegment->getSegmentId());
      }
    }
  }